

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

bool asmjit::_abi_1_10::a64::checkGpId(Operand_ *o0,Operand_ *o1,Operand_ *o2,uint32_t hiId)

{
  if ((o0->_baseId < 0x1f || o0->_baseId == 0x3f) && (o1->_baseId < 0x1f || o1->_baseId == 0x3f)) {
    return o2->_baseId == 0x3f || o2->_baseId < 0x1f;
  }
  return false;
}

Assistant:

inline constexpr uint32_t id() const noexcept { return _baseId; }